

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall Config::Config(Config *this,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  Log *pLVar3;
  char local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator local_301;
  string local_300;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  allocator local_289;
  string local_288;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  allocator local_1c1;
  string local_1c0;
  allocator local_199;
  string local_198;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  int local_28;
  int local_24;
  int option_index;
  int opt;
  char **argv_local;
  Config *pCStack_10;
  int argc_local;
  Config *this_local;
  
  _option_index = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->config_);
  local_28 = 0;
  while (local_24 = getopt_long(argv_local._4_4_,_option_index,"p:l:s:b:",Config::long_options,
                                &local_28), local_24 != -1) {
    if (local_24 == 1) {
      iVar2 = strcmp(Config::long_options[local_28].name,"server-port");
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_198,"server_port",&local_199);
        pcVar1 = _optarg;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c0,pcVar1,&local_1c1);
        SetStr(this,&local_198,&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        std::__cxx11::string::~string((string *)&local_198);
        std::allocator<char>::~allocator((allocator<char> *)&local_199);
      }
      else {
        iVar2 = strcmp(Config::long_options[local_28].name,"local-port");
        if (iVar2 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1e8,"local_port",&local_1e9);
          pcVar1 = _optarg;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_210,pcVar1,&local_211);
          SetStr(this,&local_1e8,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::allocator<char>::~allocator((allocator<char> *)&local_211);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        }
        else {
          iVar2 = strcmp(Config::long_options[local_28].name,"server-address");
          if (iVar2 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_238,"server_address",&local_239);
            pcVar1 = _optarg;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_260,pcVar1,&local_261);
            SetStr(this,&local_238,&local_260);
            std::__cxx11::string::~string((string *)&local_260);
            std::allocator<char>::~allocator((allocator<char> *)&local_261);
            std::__cxx11::string::~string((string *)&local_238);
            std::allocator<char>::~allocator((allocator<char> *)&local_239);
          }
          else {
            iVar2 = strcmp(Config::long_options[local_28].name,"local-address");
            if (iVar2 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_288,"local_address",&local_289);
              pcVar1 = _optarg;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_2b0,pcVar1,&local_2b1);
              SetStr(this,&local_288,&local_2b0);
              std::__cxx11::string::~string((string *)&local_2b0);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
              std::__cxx11::string::~string((string *)&local_288);
              std::allocator<char>::~allocator((allocator<char> *)&local_289);
            }
            else {
              iVar2 = strcmp(Config::long_options[local_28].name,"server");
              if (iVar2 == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_2d8,"is_local",&local_2d9);
                SetInt(this,&local_2d8,0);
                std::__cxx11::string::~string((string *)&local_2d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
              }
              else {
                iVar2 = strcmp(Config::long_options[local_28].name,"client");
                if (iVar2 == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_300,"is_local",&local_301);
                  SetInt(this,&local_300,1);
                  std::__cxx11::string::~string((string *)&local_300);
                  std::allocator<char>::~allocator((allocator<char> *)&local_301);
                }
              }
            }
          }
        }
      }
    }
    else if (local_24 == 0x62) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_148,"local_address",&local_149);
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_170,pcVar1,&local_171);
      SetStr(this,&local_148,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
    else if (local_24 == 0x6c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,"local_port",&local_a9);
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,pcVar1,&local_d1);
      SetStr(this,&local_a8,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
    else if (local_24 == 0x70) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_48,"server_port",&local_49);
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
      SetStr(this,&local_48,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    else if (local_24 == 0x73) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f8,"server_address",&local_f9);
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_120,pcVar1,&local_121);
      SetStr(this,&local_f8,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
    else {
      pLVar3 = Log::GetInstance();
      pLVar3 = Log::operator<<(pLVar3,yellow);
      Log::FormatTime_abi_cxx11_();
      pLVar3 = Log::operator<<(pLVar3,&local_328);
      pLVar3 = Log::operator<<(pLVar3,(char (*) [12])" [warning] ");
      pLVar3 = Log::operator<<(pLVar3,(char (*) [17])"unknown option <");
      local_329 = (char)local_24;
      pLVar3 = Log::operator<<(pLVar3,&local_329);
      Log::operator<<(pLVar3,(char (*) [2])">");
      std::__cxx11::string::~string((string *)&local_328);
    }
  }
  return;
}

Assistant:

Config::Config(int argc, char *argv[])
{
    int opt;
    static struct option long_options[] =
    {
        { "server-port", required_argument,    0, 1 },
        { "local-port", required_argument,    0, 1 },
        { "server-address", required_argument,    0, 1 },
        { "local-address", required_argument,    0, 1 },
        { "server", no_argument,    0, 1 },
        { "client", no_argument,    0, 1 },
        { NULL, 0, 0, 0 }
    };
    int option_index = 0;

    while ((opt = getopt_long(argc, argv, "p:l:s:b:", long_options, &option_index)) != -1)
    {
        switch (opt)
        {
        case 'p':
            this->SetStr("server_port", optarg);
            break;
        case 'l':
            this->SetStr("local_port", optarg);
            break;
        case 's':
            this->SetStr("server_address", optarg);
            break;
        case 'b':
            this->SetStr("local_address", optarg);
            break;
        case 1:
            if (strcmp(long_options[option_index].name, "server-port") == 0)
            {
                this->SetStr("server_port", optarg);
            }
            else if (strcmp(long_options[option_index].name, "local-port") == 0)
            {
                this->SetStr("local_port", optarg);
            }
            else if (strcmp(long_options[option_index].name, "server-address") == 0)
            {
                this->SetStr("server_address", optarg);
            }
            else if (strcmp(long_options[option_index].name, "local-address") == 0)
            {
                this->SetStr("local_address", optarg);
            }
            else if (strcmp(long_options[option_index].name, "server") == 0)
            {
                this->SetInt("is_local", 0);
            }
            else if (strcmp(long_options[option_index].name, "client") == 0)
            {
                this->SetInt("is_local", 1);
            }
            break;
        default:
            LOGW << "unknown option <" << (char)opt << ">";
        }
    }
}